

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_usadd32_riscv32(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined4 local_44;
  uint32_t di;
  uint32_t bi;
  uint32_t ai;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (_bi = 0; _bi < oprsz_00; _bi = _bi + 4) {
    local_44 = *(uint *)((long)a + _bi) + *(int *)((long)b + _bi);
    if (local_44 < *(uint *)((long)a + _bi)) {
      local_44 = 0xffffffff;
    }
    *(uint *)((long)d + _bi) = local_44;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_usadd32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        uint32_t ai = *(uint32_t *)((char *)a + i);
        uint32_t bi = *(uint32_t *)((char *)b + i);
        uint32_t di = ai + bi;
        if (di < ai) {
            di = UINT32_MAX;
        }
        *(uint32_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}